

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_DeriveCnfForWindowOne(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  Vec_Str_t *p_00;
  word Truth;
  char *__dest;
  char *__src;
  Vec_Str_t *vCnfBase;
  Vec_Wec_t *vCnfs;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  p_00 = Acb_ObjCnfs(p,iObj);
  iVar1 = Vec_StrSize(p_00);
  if (iVar1 != 0) {
    __assert_fail("Vec_StrSize(vCnfBase) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                  ,0x61,"void Acb_DeriveCnfForWindowOne(Acb_Ntk_t *, int)");
  }
  iVar1 = Vec_WecSize(&p->vCnfs);
  iVar2 = Acb_NtkObjNumMax(p);
  if (iVar1 == iVar2) {
    Truth = Acb_ObjTruth(p,iObj);
    iVar1 = Acb_ObjFaninNum(p,iObj);
    Acb_DeriveCnfFromTruth(Truth,iVar1,&p->vCover,&p->vCnf);
    iVar1 = Vec_StrSize(&p->vCnf);
    Vec_StrGrow(p_00,iVar1);
    __dest = Vec_StrArray(p_00);
    __src = Vec_StrArray(&p->vCnf);
    iVar1 = Vec_StrSize(&p->vCnf);
    memcpy(__dest,__src,(long)iVar1);
    iVar1 = Vec_StrSize(&p->vCnf);
    p_00->nSize = iVar1;
    return;
  }
  __assert_fail("Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                ,0x62,"void Acb_DeriveCnfForWindowOne(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_DeriveCnfForWindowOne( Acb_Ntk_t * p, int iObj )
{
    Vec_Wec_t * vCnfs = &p->vCnfs;
    Vec_Str_t * vCnfBase = Acb_ObjCnfs( p, iObj );
    assert( Vec_StrSize(vCnfBase) == 0 ); // unassigned
    assert( Vec_WecSize(vCnfs) == Acb_NtkObjNumMax(p) );
    Acb_DeriveCnfFromTruth( Acb_ObjTruth(p, iObj), Acb_ObjFaninNum(p, iObj), &p->vCover, &p->vCnf );
    Vec_StrGrow( vCnfBase, Vec_StrSize(&p->vCnf) );
    memcpy( Vec_StrArray(vCnfBase), Vec_StrArray(&p->vCnf), (size_t)Vec_StrSize(&p->vCnf) );
    vCnfBase->nSize = Vec_StrSize(&p->vCnf);
}